

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O2

int CfdGetTaprootTweakedPrivkey
              (void *handle,void *tree_handle,char *internal_privkey,char **tweaked_privkey)

{
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *this;
  bool bVar1;
  reference object;
  char *pcVar2;
  CfdException *pCVar3;
  allocator local_101;
  string local_100;
  Privkey taproot_privkey;
  Privkey privkey;
  TapBranch branch;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&branch,"TapscriptTree",(allocator *)&privkey);
  cfd::capi::CheckBuffer(tree_handle,(string *)&branch);
  std::__cxx11::string::~string((string *)&branch);
  bVar1 = cfd::capi::IsEmptyString(internal_privkey);
  if (bVar1) {
    branch._vptr_TapBranch = (_func_int **)0x4fb1b0;
    branch.has_leaf_ = true;
    branch.leaf_version_ = '\x04';
    branch._10_2_ = 0;
    branch.script_._vptr_Script = (_func_int **)anon_var_dwarf_74a9ce;
    cfd::core::logger::warn<>((CfdSourceLocation *)&branch,"internal_privkey is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&branch,"Failed to parameter. internal_privkey is null or empty.",
               (allocator *)&privkey);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&branch);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (tweaked_privkey != (char **)0x0) {
    cfd::core::TapBranch::TapBranch(&branch);
    this = *(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
            ((long)tree_handle + 0x18);
    if ((this->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>).
        _M_impl.super__Vector_impl_data._M_start ==
        (this->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      object = std::
               vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::
               at(*(vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                    **)((long)tree_handle + 0x10),0);
    }
    else {
      object = (reference)
               std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at(this,0);
    }
    cfd::core::TapBranch::operator=(&branch,&object->super_TapBranch);
    cfd::core::Privkey::Privkey(&privkey);
    std::__cxx11::string::string
              ((string *)&taproot_privkey,internal_privkey,(allocator *)&local_100);
    bVar1 = cfd::core::Privkey::HasWif((string *)&taproot_privkey,(NetType *)0x0,(bool *)0x0);
    std::__cxx11::string::~string((string *)&taproot_privkey);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_100,internal_privkey,&local_101);
      cfd::core::Privkey::FromWif(&taproot_privkey,&local_100,kCustomChain,true);
    }
    else {
      std::__cxx11::string::string((string *)&local_100,internal_privkey,&local_101);
      cfd::core::Privkey::Privkey(&taproot_privkey,&local_100,kMainnet,true);
    }
    cfd::core::Privkey::operator=(&privkey,&taproot_privkey);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&taproot_privkey);
    std::__cxx11::string::~string((string *)&local_100);
    cfd::core::TapBranch::GetTweakedPrivkey(&taproot_privkey,&branch,&privkey,(bool *)0x0);
    cfd::core::Privkey::GetHex_abi_cxx11_(&local_100,&taproot_privkey);
    pcVar2 = cfd::capi::CreateString(&local_100);
    *tweaked_privkey = pcVar2;
    std::__cxx11::string::~string((string *)&local_100);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&taproot_privkey);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&privkey);
    cfd::core::TapBranch::~TapBranch(&branch);
    return 0;
  }
  branch._vptr_TapBranch = (_func_int **)0x4fb1b0;
  branch.has_leaf_ = true;
  branch.leaf_version_ = '\x04';
  branch._10_2_ = 0;
  branch.script_._vptr_Script = (_func_int **)anon_var_dwarf_74a9ce;
  cfd::core::logger::warn<>((CfdSourceLocation *)&branch,"tweaked_privkey is null.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&branch,"Failed to parameter. tweaked_privkey is null.",(allocator *)&privkey
            );
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&branch);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTaprootTweakedPrivkey(
    void* handle, void* tree_handle, const char* internal_privkey,
    char** tweaked_privkey) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    if (IsEmptyString(internal_privkey)) {
      warn(CFD_LOG_SOURCE, "internal_privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. internal_privkey is null or empty.");
    }
    if (tweaked_privkey == nullptr) {
      warn(CFD_LOG_SOURCE, "tweaked_privkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tweaked_privkey is null.");
    }
    TapBranch branch;
    if (!buffer->branch_buffer->empty()) {
      branch = buffer->branch_buffer->at(0);
    } else {
      branch = buffer->tree_buffer->at(0);
    }
    Privkey privkey;
    if (Privkey::HasWif(internal_privkey)) {
      privkey = Privkey::FromWif(internal_privkey);
    } else {
      privkey = Privkey(internal_privkey);
    }
    auto taproot_privkey = branch.GetTweakedPrivkey(privkey);
    *tweaked_privkey = CreateString(taproot_privkey.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}